

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.cc
# Opt level: O1

EvalString * __thiscall Rule::GetBinding(Rule *this,string *key)

{
  const_iterator cVar1;
  _Base_ptr p_Var2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString>_>_>
          ::find(&(this->bindings_)._M_t,key);
  p_Var2 = (_Base_ptr)0x0;
  if ((_Rb_tree_header *)cVar1._M_node != &(this->bindings_)._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = cVar1._M_node + 2;
  }
  return (EvalString *)p_Var2;
}

Assistant:

const EvalString* Rule::GetBinding(const string& key) const {
  Bindings::const_iterator i = bindings_.find(key);
  if (i == bindings_.end())
    return NULL;
  return &i->second;
}